

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

string * __thiscall
DDSInfo::PrintTexMiscFlagNames_abi_cxx11_(string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  pointer pcVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 4) != 0) {
    if (DAT_00143480 == (undefined8 *)0x0) {
      puVar4 = &DAT_00143478;
    }
    else {
      puVar2 = &DAT_00143478;
      puVar4 = DAT_00143480;
      do {
        if (*(uint *)(puVar4 + 4) >= 4) {
          puVar2 = puVar4;
        }
        puVar4 = (undefined8 *)puVar4[(ulong)(*(uint *)(puVar4 + 4) < 4) + 2];
      } while (puVar4 != (undefined8 *)0x0);
      puVar4 = &DAT_00143478;
      if ((puVar2 != &DAT_00143478) && (puVar4 = &DAT_00143478, *(uint *)(puVar2 + 4) < 5)) {
        puVar4 = puVar2;
      }
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)local_40,puVar4[5],puVar4[6] + puVar4[5]);
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      uVar3 = (ulong)((int)__return_storage_ptr__->_M_string_length - 1);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (pcVar1[uVar3] == '|') {
        __return_storage_ptr__->_M_string_length = uVar3;
        pcVar1[uVar3] = '\0';
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrintTexMiscFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,texture_misc_flag_names)
    #include "defs/dds/texture_misc_flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }